

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

bool __thiscall ON_Brep::HasSlits(ON_Brep *this,ON_BrepLoop *L)

{
  bool bVar1;
  undefined8 in_RAX;
  int t1;
  int t0;
  undefined8 uStack_8;
  
  if (-1 < L->m_loop_index) {
    uStack_8 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    if (L->m_type != slit) {
      bVar1 = FoundSlitPair(L,(int *)((long)&uStack_8 + 4),(int *)&uStack_8);
      uStack_8 = (ulong)bVar1;
    }
    return SUB81(uStack_8,0);
  }
  return false;
}

Assistant:

bool ON_Brep::HasSlits(const ON_BrepLoop& L) const

{
  if (L.m_loop_index < 0)
    return false;
  if (L.m_type == ON_BrepLoop::slit)
    return true;
  int t0, t1;
  return FoundSlitPair(L, &t0, &t1);
}